

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O0

bool __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::AddChunk
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this,size_t capacity)

{
  void *pvVar1;
  undefined8 *puVar2;
  undefined8 in_RSI;
  CrtAllocator *in_RDI;
  ChunkHeader *chunk;
  
  if (*(long *)(in_RDI + 8) == 0) {
    pvVar1 = operator_new(1);
    *(void **)(in_RDI + 8) = pvVar1;
    *(void **)(*(long *)(in_RDI + 0x10) + 8) = pvVar1;
  }
  puVar2 = (undefined8 *)CrtAllocator::Malloc(in_RDI,0x36b111);
  if (puVar2 != (undefined8 *)0x0) {
    *puVar2 = in_RSI;
    puVar2[1] = 0;
    puVar2[2] = **(undefined8 **)(in_RDI + 0x10);
    **(undefined8 **)(in_RDI + 0x10) = puVar2;
  }
  return puVar2 != (undefined8 *)0x0;
}

Assistant:

bool AddChunk(size_t capacity) {
        if (!baseAllocator_)
            shared_->ownBaseAllocator = baseAllocator_ = RAPIDJSON_NEW(BaseAllocator)();
        if (ChunkHeader* chunk = static_cast<ChunkHeader*>(baseAllocator_->Malloc(SIZEOF_CHUNK_HEADER + capacity))) {
            chunk->capacity = capacity;
            chunk->size = 0;
            chunk->next = shared_->chunkHead;
            shared_->chunkHead = chunk;
            return true;
        }
        else
            return false;
    }